

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int memjrnlWrite(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  sqlite3_io_methods *psVar6;
  sqlite3_io_methods *psVar7;
  sqlite3_io_methods *psVar8;
  sqlite3_io_methods *psVar9;
  sqlite3_io_methods *psVar10;
  sqlite3_io_methods *psVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  sqlite3_file sVar16;
  sqlite3_io_methods *psVar17;
  size_t __n;
  sqlite3_io_methods *psVar18;
  sqlite3_io_methods *p;
  int iVar19;
  
  lVar15 = (long)*(int *)((long)&pJfd[1].pMethods + 4);
  if ((0 < lVar15) && (lVar15 < iAmt + iOfst)) {
    puVar1 = (undefined8 *)((long)&pJfd[1].pMethods + 4);
    psVar18 = pJfd->pMethods;
    iVar14 = *(int *)&pJfd[1].pMethods;
    uVar2 = *(undefined4 *)((long)&pJfd[2].pMethods + 4);
    uVar5 = *puVar1;
    p = pJfd[3].pMethods;
    psVar6 = pJfd[4].pMethods;
    psVar7 = pJfd[7].pMethods;
    psVar10 = pJfd[5].pMethods;
    psVar11 = pJfd[6].pMethods;
    uVar3 = *(undefined4 *)&pJfd[8].pMethods;
    uVar4 = *(undefined4 *)((long)&pJfd[8].pMethods + 4);
    psVar8 = pJfd[9].pMethods;
    psVar9 = pJfd[10].pMethods;
    pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
    pJfd->pMethods = (sqlite3_io_methods *)0x0;
    pJfd[1].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[7].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[8].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[9].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[10].pMethods = (sqlite3_io_methods *)0x0;
    iVar13 = (*psVar8->xSync)((sqlite3_file *)psVar8,(int)psVar9);
    psVar17 = p;
    if (iVar13 == 0) {
      iVar13 = 0;
      if (p != (sqlite3_io_methods *)0x0) {
        lVar15 = 0;
        iVar19 = iVar14;
        do {
          if ((long)psVar6 < lVar15 + iVar19) {
            iVar19 = (int)psVar6 - (int)lVar15;
          }
          iVar13 = (*pJfd->pMethods->xWrite)(pJfd,&psVar17->xClose,iVar19,lVar15);
          if (iVar13 != 0) goto LAB_00135b69;
          lVar15 = lVar15 + iVar19;
          psVar17 = *(sqlite3_io_methods **)psVar17;
        } while (psVar17 != (sqlite3_io_methods *)0x0);
        iVar13 = 0;
      }
LAB_00135b69:
      psVar17 = (sqlite3_io_methods *)0x0;
      if (iVar13 != 0) {
        psVar17 = p;
      }
      if ((p != (sqlite3_io_methods *)0x0) && (iVar13 == 0)) {
        do {
          psVar17 = *(sqlite3_io_methods **)p;
          sqlite3_free(p);
          p = psVar17;
        } while (psVar17 != (sqlite3_io_methods *)0x0);
        psVar17 = (sqlite3_io_methods *)0x0;
      }
    }
    if (iVar13 != 0) {
      if (pJfd->pMethods != (sqlite3_io_methods *)0x0) {
        (*pJfd->pMethods->xClose)(pJfd);
        pJfd->pMethods = (sqlite3_io_methods *)0x0;
      }
      pJfd->pMethods = psVar18;
      *(int *)&pJfd[1].pMethods = iVar14;
      *(undefined4 *)((long)&pJfd[2].pMethods + 4) = uVar2;
      *puVar1 = uVar5;
      pJfd[3].pMethods = psVar17;
      pJfd[4].pMethods = psVar6;
      pJfd[7].pMethods = psVar7;
      pJfd[5].pMethods = psVar10;
      pJfd[6].pMethods = psVar11;
      *(undefined4 *)&pJfd[8].pMethods = uVar3;
      *(undefined4 *)((long)&pJfd[8].pMethods + 4) = uVar4;
      pJfd[9].pMethods = psVar8;
      pJfd[10].pMethods = psVar9;
      if (iVar13 != 0) {
        return iVar13;
      }
    }
    iVar14 = (*pJfd->pMethods->xWrite)(pJfd,zBuf,iAmt,iOfst);
    return iVar14;
  }
  iVar14 = iAmt;
  do {
    if (iVar14 < 1) {
      *(int *)&pJfd[2].pMethods = (int)iOfst + iAmt;
      return 0;
    }
    iVar13 = *(int *)&pJfd[1].pMethods;
    lVar15 = (long)pJfd[4].pMethods % (long)iVar13;
    iVar19 = iVar13 - (int)lVar15;
    if (iVar14 < iVar19) {
      iVar19 = iVar14;
    }
    if (lVar15 == 0) {
      psVar18 = pJfd[5].pMethods;
      sVar16.pMethods = (sqlite3_io_methods *)sqlite3_malloc(iVar13 + 8);
      if (sVar16.pMethods != (sqlite3_io_methods *)0x0) {
        *(undefined8 *)sVar16.pMethods = 0;
        if (psVar18 == (sqlite3_io_methods *)0x0) {
          psVar18 = (sqlite3_io_methods *)(pJfd + 3);
        }
        *(sqlite3_io_methods **)psVar18 = sVar16.pMethods;
        pJfd[5].pMethods = sVar16.pMethods;
        goto LAB_00135ab4;
      }
      bVar12 = false;
    }
    else {
LAB_00135ab4:
      __n = (size_t)iVar19;
      memcpy((void *)((long)&(pJfd[5].pMethods)->xClose + lVar15),zBuf,__n);
      zBuf = (void *)((long)zBuf + __n);
      iVar14 = iVar14 - iVar19;
      pJfd[4].pMethods = (sqlite3_io_methods *)((long)&(pJfd[4].pMethods)->iVersion + __n);
      bVar12 = true;
    }
    if (!bVar12) {
      return 0xc0a;
    }
  } while( true );
}

Assistant:

static int memjrnlWrite(
  sqlite3_file *pJfd,    /* The journal file into which to write */
  const void *zBuf,      /* Take data to be written from here */
  int iAmt,              /* Number of bytes to write */
  sqlite_int64 iOfst     /* Begin writing at this offset into the file */
){
  MemJournal *p = (MemJournal *)pJfd;
  int nWrite = iAmt;
  u8 *zWrite = (u8 *)zBuf;

  /* If the file should be created now, create it and write the new data
  ** into the file on disk. */
  if( p->nSpill>0 && (iAmt+iOfst)>p->nSpill ){
    int rc = memjrnlCreateFile(p);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsWrite(pJfd, zBuf, iAmt, iOfst);
    }
    return rc;
  }

  /* If the contents of this write should be stored in memory */
  else{
    /* An in-memory journal file should only ever be appended to. Random
    ** access writes are not required. The only exception to this is when
    ** the in-memory journal is being used by a connection using the
    ** atomic-write optimization. In this case the first 28 bytes of the
    ** journal file may be written as part of committing the transaction. */ 
    assert( iOfst==p->endpoint.iOffset || iOfst==0 );
#if defined(SQLITE_ENABLE_ATOMIC_WRITE) \
 || defined(SQLITE_ENABLE_BATCH_ATOMIC_WRITE)
    if( iOfst==0 && p->pFirst ){
      assert( p->nChunkSize>iAmt );
      memcpy((u8*)p->pFirst->zChunk, zBuf, iAmt);
    }else
#else
    assert( iOfst>0 || p->pFirst==0 );
#endif
    {
      while( nWrite>0 ){
        FileChunk *pChunk = p->endpoint.pChunk;
        int iChunkOffset = (int)(p->endpoint.iOffset%p->nChunkSize);
        int iSpace = MIN(nWrite, p->nChunkSize - iChunkOffset);

        if( iChunkOffset==0 ){
          /* New chunk is required to extend the file. */
          FileChunk *pNew = sqlite3_malloc(fileChunkSize(p->nChunkSize));
          if( !pNew ){
            return SQLITE_IOERR_NOMEM_BKPT;
          }
          pNew->pNext = 0;
          if( pChunk ){
            assert( p->pFirst );
            pChunk->pNext = pNew;
          }else{
            assert( !p->pFirst );
            p->pFirst = pNew;
          }
          p->endpoint.pChunk = pNew;
        }

        memcpy((u8*)p->endpoint.pChunk->zChunk + iChunkOffset, zWrite, iSpace);
        zWrite += iSpace;
        nWrite -= iSpace;
        p->endpoint.iOffset += iSpace;
      }
      p->nSize = iAmt + iOfst;
    }
  }

  return SQLITE_OK;
}